

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void duckdb::GenerateUUIDv7Function(DataChunk *args,ExpressionState *state,Vector *result)

{
  FunctionLocalState *pFVar1;
  ulong uVar2;
  int64_t *piVar3;
  hugeint_t hVar4;
  optional_ptr<duckdb::FunctionLocalState,_true> local_28;
  
  local_28.ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
  pFVar1 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->(&local_28);
  Vector::SetVectorType(result,FLAT_VECTOR);
  piVar3 = (int64_t *)(result->data + 8);
  for (uVar2 = 0; uVar2 < args->count; uVar2 = uVar2 + 1) {
    hVar4 = UUIDv7::GenerateRandomUUID((RandomEngine *)(pFVar1 + 1));
    piVar3[-1] = hVar4.lower;
    *piVar3 = hVar4.upper;
    piVar3 = piVar3 + 2;
  }
  return;
}

Assistant:

static void GenerateUUIDv7Function(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 0);
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RandomLocalState>();

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<hugeint_t>(result);

	for (idx_t i = 0; i < args.size(); i++) {
		result_data[i] = UUIDv7::GenerateRandomUUID(lstate.random_engine);
	}
}